

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
  *this_00;
  RemovingLiteralMatcher *t;
  Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
  *elem;
  long in_RDI;
  RemovingLiteralMatcher *in_stack_ffffffffffffffa8;
  DefaultKeepRecycled *in_stack_ffffffffffffffb0;
  DefaultKeepRecycled local_10 [16];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                      *)0x2f8648);
  if (bVar1) {
    self((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          *)0x2f8667);
    bVar1 = DefaultKeepRecycled::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,Lib::NoReset,Lib::DefaultKeepRecycled>
         ::memAlive & 1) != 0)) {
      this_00 = (Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
                 *)(in_RDI + 8);
      t = self((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                *)0x2f86ac);
      NoReset::operator()((NoReset *)this_00,t);
      elem = mem();
      in_stack_ffffffffffffffb0 = local_10;
      std::
      unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ::unique_ptr((unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                    *)in_stack_ffffffffffffffb0,
                   (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                    *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
      ::push(this_00,(unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                      *)elem);
      std::
      unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ::~unique_ptr((unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                     *)in_stack_ffffffffffffffb0);
    }
  }
  std::
  unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
  ::~unique_ptr((unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                 *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }